

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O2

void TestStringToDoubleVarious(void)

{
  ulong in_RAX;
  bool *pbVar1;
  bool *pbVar2;
  int in_R9D;
  double dVar3;
  bool all_used;
  ulong uStack_38;
  int processed;
  
  pbVar2 = &all_used;
  pbVar1 = pbVar2;
  uStack_38 = in_RAX;
  dVar3 = StrToD("",0x38,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x776,0xc0f3fe,"StrToD(\"\", flags, 0.0, &processed, &all_used)",0.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0x777,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("",0x38,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x779,0xc15dcd,"StrToD(\"\", flags, 1.0, &processed, &all_used)",1.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0x77a,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("  ",0x38,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x77c,0xc0f3fe,"StrToD(\"  \", flags, 0.0, &processed, &all_used)",0.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0x77d,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("  ",0x38,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x77f,0xc15dcd,"StrToD(\"  \", flags, 1.0, &processed, &all_used)",1.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0x780,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("42",0x38,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x782,0xc13197,"StrToD(\"42\", flags, 0.0, &processed, &all_used)",42.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0x783,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" + 42 ",0x38,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x785,0xc13197,"StrToD(\" + 42 \", flags, 0.0, &processed, &all_used)",
                    42.0,pbVar1,dVar3);
  CheckHelper((char *)0x786,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" - 42 ",0x38,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x788,0xc13196,"StrToD(\" - 42 \", flags, 0.0, &processed, &all_used)",
                    -42.0,pbVar1,dVar3);
  CheckHelper((char *)0x789,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("x",0x38,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x78b,0xc131d7,"StrToD(\"x\", flags, 1.0, &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0x78c,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" x",0x38,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x78e,0xc131d7,"StrToD(\" x\", flags, 1.0, &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0x78f,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("42x",0x38,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x791,0xc131d7,"StrToD(\"42x\", flags, 0.0, &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0x792,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("42 x",0x38,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x794,0xc131d7,"StrToD(\"42 x\", flags, 0.0, &processed, &all_used)",NAN
                    ,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x795,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" + 42 x",0x38,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x797,0xc131d7,"StrToD(\" + 42 x\", flags, 0.0, &processed, &all_used)",
                    NAN,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x798,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" - 42 x",0x38,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x79a,0xc131d7,"StrToD(\" - 42 x\", flags, 0.0, &processed, &all_used)",
                    NAN,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x79b,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("123e",4,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7a0,0xc0f7e2,"StrToD(\"123e\", flags, 0.0, &processed, &all_used)",
                    123.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x7a1,0xc13214,(char *)(uStack_38 >> 0x20),0xc139c9,(char *)0x3,in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("123e-",4,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7a3,0xc0f7e2,"StrToD(\"123e-\", flags, 0.0, &processed, &all_used)",
                    123.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x7a4,0xc13214,(char *)(uStack_38 >> 0x20),0xc139c9,(char *)0x3,in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("123e-a",4,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7a6,0xc0f7e2,"StrToD(\"123e-a\", flags, 0.0, &processed, &all_used)",
                    123.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x7a7,0xc13214,(char *)(uStack_38 >> 0x20),0xc139c9,(char *)0x3,in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("",0x3c,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7af,0xc0f3fe,"StrToD(\"\", flags, 0.0, &processed, &all_used)",0.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0x7b0,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("",0x3c,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7b2,0xc15dcd,"StrToD(\"\", flags, 1.0, &processed, &all_used)",1.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0x7b3,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("  ",0x3c,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7b5,0xc0f3fe,"StrToD(\"  \", flags, 0.0, &processed, &all_used)",0.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0x7b6,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("  ",0x3c,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7b8,0xc15dcd,"StrToD(\"  \", flags, 1.0, &processed, &all_used)",1.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0x7b9,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("42",0x3c,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7bb,0xc13197,"StrToD(\"42\", flags, 0.0, &processed, &all_used)",42.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0x7bc,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" + 42 ",0x3c,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7be,0xc13197,"StrToD(\" + 42 \", flags, 0.0, &processed, &all_used)",
                    42.0,pbVar1,dVar3);
  CheckHelper((char *)0x7bf,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" - 42 ",0x3c,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7c1,0xc13196,"StrToD(\" - 42 \", flags, 0.0, &processed, &all_used)",
                    -42.0,pbVar1,dVar3);
  CheckHelper((char *)0x7c2,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("x",0x3c,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7c4,0xc131d7,"StrToD(\"x\", flags, 1.0, &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0x7c5,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" x",0x3c,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7c7,0xc131d7,"StrToD(\" x\", flags, 1.0, &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0x7c8,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("42x",0x3c,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7ca,0xc13197,"StrToD(\"42x\", flags, 0.0, &processed, &all_used)",42.0
                    ,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x7cb,0xc17303,(char *)0x2,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("42 x",0x3c,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7cd,0xc13197,"StrToD(\"42 x\", flags, 0.0, &processed, &all_used)",
                    42.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x7ce,0xc139c9,(char *)0x3,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" + 42 x",0x3c,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7d0,0xc13197,"StrToD(\" + 42 x\", flags, 0.0, &processed, &all_used)",
                    42.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x7d1,0xc0e14c,(char *)0x6,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" - 42 x",0x3c,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7d3,0xc13196,"StrToD(\" - 42 x\", flags, 0.0, &processed, &all_used)",
                    -42.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x7d4,0xc0e14c,(char *)0x6,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("",0x2c,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7db,0xc0f3fe,"StrToD(\"\", flags, 0.0, &processed, &all_used)",0.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0x7dc,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("",0x2c,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7de,0xc15dcd,"StrToD(\"\", flags, 1.0, &processed, &all_used)",1.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0x7df,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("  ",0x2c,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7e1,0xc0f3fe,"StrToD(\"  \", flags, 0.0, &processed, &all_used)",0.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0x7e2,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("  ",0x2c,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7e4,0xc15dcd,"StrToD(\"  \", flags, 1.0, &processed, &all_used)",1.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0x7e5,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("42",0x2c,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7e7,0xc13197,"StrToD(\"42\", flags, 0.0, &processed, &all_used)",42.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0x7e8,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  dVar3 = StrToD(" + 42 ",0x2c,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7ea,0xc13197,"StrToD(\" + 42 \", flags, 0.0, &processed, &all_used)",
                    42.0,pbVar2,dVar3);
  CheckEqualsHelper((char *)0x7eb,0xc1dc94,(char *)0x5,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  pbVar1 = pbVar2;
  dVar3 = StrToD(" - 42 ",0x2c,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7ed,0xc13196,"StrToD(\" - 42 \", flags, 0.0, &processed, &all_used)",
                    -42.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x7ee,0xc1dc94,(char *)0x5,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  dVar3 = StrToD("x",0x2c,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7f0,0xc131d7,"StrToD(\"x\", flags, 1.0, &processed, &all_used)",NAN,
                    pbVar2,dVar3);
  CheckEqualsHelper((char *)0x7f1,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  pbVar1 = pbVar2;
  dVar3 = StrToD(" x",0x2c,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7f3,0xc131d7,"StrToD(\" x\", flags, 1.0, &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0x7f4,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("42x",0x2c,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7f6,0xc13197,"StrToD(\"42x\", flags, 0.0, &processed, &all_used)",42.0
                    ,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x7f7,0xc17303,(char *)0x2,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("42 x",0x2c,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7f9,0xc13197,"StrToD(\"42 x\", flags, 0.0, &processed, &all_used)",
                    42.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x7fa,0xc17303,(char *)0x2,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" + 42 x",0x2c,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7fc,0xc13197,"StrToD(\" + 42 x\", flags, 0.0, &processed, &all_used)",
                    42.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x7fd,0xc1dc94,(char *)0x5,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" - 42 x",0x2c,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x7ff,0xc13196,"StrToD(\" - 42 x\", flags, 0.0, &processed, &all_used)",
                    -42.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x800,0xc1dc94,(char *)0x5,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" +42 ",0xc,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x805,0xc13197,"StrToD(\" +42 \", flags, 0.0, &processed, &all_used)",
                    42.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x806,0xc172c1,(char *)0x4,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" -42 ",0xc,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x808,0xc13196,"StrToD(\" -42 \", flags, 0.0, &processed, &all_used)",
                    -42.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x809,0xc172c1,(char *)0x4,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" + 42 ",0xc,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x80b,0xc131d7,"StrToD(\" + 42 \", flags, 0.0, &processed, &all_used)",
                    NAN,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x80c,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" - 42 ",0xc,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x80e,0xc131d7,"StrToD(\" - 42 \", flags, 0.0, &processed, &all_used)",
                    NAN,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x80f,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("",0,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x814,0xc0f3fe,"StrToD(\"\", flags, 0.0, &processed, &all_used)",0.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0x815,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("",0,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x817,0xc15dcd,"StrToD(\"\", flags, 1.0, &processed, &all_used)",1.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0x818,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("  ",0,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x81a,0xc131d7,"StrToD(\"  \", flags, 0.0, &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0x81b,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("  ",0,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x81d,0xc131d7,"StrToD(\"  \", flags, 1.0, &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0x81e,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("42",0,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x820,0xc13197,"StrToD(\"42\", flags, 0.0, &processed, &all_used)",42.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0x821,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" + 42 ",0,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x823,0xc131d7,"StrToD(\" + 42 \", flags, 0.0, &processed, &all_used)",
                    NAN,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x824,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" - 42 ",0,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x826,0xc131d7,"StrToD(\" - 42 \", flags, 0.0, &processed, &all_used)",
                    NAN,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x827,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("x",0,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x829,0xc131d7,"StrToD(\"x\", flags, 1.0, &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0x82a,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" x",0,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x82c,0xc131d7,"StrToD(\" x\", flags, 1.0, &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0x82d,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("42x",0,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x82f,0xc131d7,"StrToD(\"42x\", flags, 0.0, &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0x830,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("42 x",0,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x832,0xc131d7,"StrToD(\"42 x\", flags, 0.0, &processed, &all_used)",NAN
                    ,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x833,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" + 42 x",0,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x835,0xc131d7,"StrToD(\" + 42 x\", flags, 0.0, &processed, &all_used)",
                    NAN,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x836,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" - 42 x",0,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x838,0xc131d7,"StrToD(\" - 42 x\", flags, 0.0, &processed, &all_used)",
                    NAN,pbVar1,dVar3);
  CheckEqualsHelper((char *)0x839,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" ",8,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x83e,0xc0f3fe,"StrToD(\" \", flags, 0.0, &processed, &all_used)",0.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0x83f,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" ",8,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x841,0xc15dcd,"StrToD(\" \", flags, 1.0, &processed, &all_used)",1.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0x842,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 42",8,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x844,0xc13197,"StrToD(\" 42\", flags, 0.0, &processed, &all_used)",42.0
                    ,pbVar1,dVar3);
  CheckHelper((char *)0x845,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("42 ",8,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x847,0xc131d7,"StrToD(\"42 \", flags, 0.0, &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0x848,0xc1672e,(char *)0x0,0xc13214,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" ",0x10,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x84d,0xc0f3fe,"StrToD(\" \", flags, 0.0, &processed, &all_used)",0.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0x84e,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" ",0x10,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x850,0xc15dcd,"StrToD(\" \", flags, 1.0, &processed, &all_used)",1.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0x851,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("42 ",0x10,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x853,0xc13197,"StrToD(\"42 \", flags, 0.0, &processed, &all_used)",42.0
                    ,pbVar1,dVar3);
  CheckHelper((char *)0x854,0xc13094,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  dVar3 = StrToD(" 42",0x10,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0x856,0xc131d7,"StrToD(\" 42\", flags, 0.0, &processed, &all_used)",NAN,
                    pbVar2,dVar3);
  CheckEqualsHelper((char *)0x857,0xc1672e,(char *)0x0,0xc13214,(char *)(ulong)(uint)processed,
                    in_R9D);
  return;
}

Assistant:

TEST(StringToDoubleVarious) {
  int flags;
  int processed;
  bool all_used;

  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES;

  CHECK_EQ(0.0, StrToD("", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("  ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("  ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0, StrToD("42", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0, StrToD(" + 42 ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-42.0, StrToD(" - 42 ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("x", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" x", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("42x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" + 42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" - 42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::ALLOW_TRAILING_JUNK;

  CHECK_EQ(123.0, StrToD("123e", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 3);

  CHECK_EQ(123.0, StrToD("123e-", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 3);

  CHECK_EQ(123.0, StrToD("123e-a", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 3);


  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;

  CHECK_EQ(0.0, StrToD("", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("  ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("  ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0, StrToD("42", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0, StrToD(" + 42 ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-42.0, StrToD(" - 42 ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("x", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" x", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(42.0, StrToD("42x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(42.0, StrToD("42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(3, processed);

  CHECK_EQ(42.0, StrToD(" + 42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(6, processed);

  CHECK_EQ(-42.0, StrToD(" - 42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(6, processed);


  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;

  CHECK_EQ(0.0, StrToD("", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("  ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("  ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0, StrToD("42", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0, StrToD(" + 42 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(5, processed);

  CHECK_EQ(-42.0, StrToD(" - 42 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(5, processed);

  CHECK_EQ(Double::NaN(), StrToD("x", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" x", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(42.0, StrToD("42x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(42.0, StrToD("42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(42.0, StrToD(" + 42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(5, processed);

  CHECK_EQ(-42.0, StrToD(" - 42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(5, processed);

  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;

  CHECK_EQ(42.0, StrToD(" +42 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(4, processed);

  CHECK_EQ(-42.0, StrToD(" -42 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(4, processed);

  CHECK_EQ(Double::NaN(), StrToD(" + 42 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" - 42 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::NO_FLAGS;

  CHECK_EQ(0.0, StrToD("", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("  ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("  ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(42.0, StrToD("42", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD(" + 42 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" - 42 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("x", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" x", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("42x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" + 42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" - 42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES;

  CHECK_EQ(0.0, StrToD(" ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD(" ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0, StrToD(" 42", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("42 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::ALLOW_TRAILING_SPACES;

  CHECK_EQ(0.0, StrToD(" ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD(" ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0, StrToD("42 ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD(" 42", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);
}